

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O3

bool __thiscall cmQtAutoGenInitializer::SetupWriteAutogenInfo(cmQtAutoGenInitializer *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char cVar4;
  cmMakefile *this_00;
  pointer pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  cmGeneratorTarget *pcVar7;
  pointer pcVar8;
  string *psVar9;
  uint uVar10;
  char *pcVar11;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *p_Var12;
  _Hash_node_base *p_Var13;
  string err;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sources;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uic_skip;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  moc_skip;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uic_sources;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uic_headers;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  moc_sources;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  moc_headers;
  InfoWriter ofs;
  allocator<char> local_449;
  undefined1 local_448 [32];
  _Base_ptr local_428;
  size_t local_420;
  string local_418;
  undefined1 local_3f8 [32];
  _Base_ptr local_3d8;
  size_t local_3d0;
  string local_3c8;
  uint local_3a4;
  cmMakefile *local_3a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_398;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_368;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_338;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_308;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  undefined1 local_278 [584];
  
  InfoWriter::InfoWriter((InfoWriter *)local_278,&(this->AutogenTarget).InfoFile);
  uVar10 = *(uint *)(*(_func_int **)(local_278._0_8_ + -0x18) + (long)(local_278 + 0x20));
  if ((uVar10 & 5) == 0) {
    this_00 = this->Target->Target->Makefile;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"# Meta\n",7);
    pcVar11 = "FALSE";
    if ((ulong)this->MultiConfig != 0) {
      pcVar11 = "TRUE";
    }
    pcVar8 = local_448 + 0x10;
    local_448._0_8_ = pcVar8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_448,pcVar11,pcVar11 + ((ulong)this->MultiConfig ^ 5));
    InfoWriter::Write((InfoWriter *)local_278,"AM_MULTI_CONFIG",(string *)local_448);
    if ((pointer)local_448._0_8_ != pcVar8) {
      operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
    }
    InfoWriter::Write((InfoWriter *)local_278,"AM_PARALLEL",&(this->AutogenTarget).Parallel);
    InfoWriter::Write((InfoWriter *)local_278,"AM_VERBOSITY",&this->Verbosity);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"# Directories\n",0xe);
    local_448._0_8_ = pcVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"CMAKE_SOURCE_DIR","");
    psVar9 = cmMakefile::GetSafeDefinition(this_00,(string *)local_448);
    pcVar1 = local_3f8 + 0x10;
    pcVar5 = (psVar9->_M_dataplus)._M_p;
    local_3f8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_3f8,pcVar5,pcVar5 + psVar9->_M_string_length);
    if ((pointer)local_448._0_8_ != pcVar8) {
      operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
    }
    InfoWriter::Write((InfoWriter *)local_278,"AM_CMAKE_SOURCE_DIR",(string *)local_3f8);
    if ((pointer)local_3f8._0_8_ != pcVar1) {
      operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
    }
    local_448._0_8_ = pcVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"CMAKE_BINARY_DIR","");
    psVar9 = cmMakefile::GetSafeDefinition(this_00,(string *)local_448);
    pcVar5 = (psVar9->_M_dataplus)._M_p;
    local_3f8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_3f8,pcVar5,pcVar5 + psVar9->_M_string_length);
    if ((pointer)local_448._0_8_ != pcVar8) {
      operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
    }
    InfoWriter::Write((InfoWriter *)local_278,"AM_CMAKE_BINARY_DIR",(string *)local_3f8);
    if ((pointer)local_3f8._0_8_ != pcVar1) {
      operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
    }
    local_448._0_8_ = pcVar8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_448,"CMAKE_CURRENT_SOURCE_DIR","");
    psVar9 = cmMakefile::GetSafeDefinition(this_00,(string *)local_448);
    pcVar5 = (psVar9->_M_dataplus)._M_p;
    local_3f8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_3f8,pcVar5,pcVar5 + psVar9->_M_string_length);
    if ((pointer)local_448._0_8_ != pcVar8) {
      operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
    }
    InfoWriter::Write((InfoWriter *)local_278,"AM_CMAKE_CURRENT_SOURCE_DIR",(string *)local_3f8);
    if ((pointer)local_3f8._0_8_ != pcVar1) {
      operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
    }
    local_448._0_8_ = pcVar8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_448,"CMAKE_CURRENT_BINARY_DIR","");
    psVar9 = cmMakefile::GetSafeDefinition(this_00,(string *)local_448);
    pcVar5 = (psVar9->_M_dataplus)._M_p;
    local_3f8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_3f8,pcVar5,pcVar5 + psVar9->_M_string_length);
    if ((pointer)local_448._0_8_ != pcVar8) {
      operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
    }
    InfoWriter::Write((InfoWriter *)local_278,"AM_CMAKE_CURRENT_BINARY_DIR",(string *)local_3f8);
    if ((pointer)local_3f8._0_8_ != pcVar1) {
      operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
    }
    local_448._0_8_ = pcVar8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_448,"CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE","");
    psVar9 = cmMakefile::GetSafeDefinition(this_00,(string *)local_448);
    pcVar5 = (psVar9->_M_dataplus)._M_p;
    local_3f8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_3f8,pcVar5,pcVar5 + psVar9->_M_string_length);
    if ((pointer)local_448._0_8_ != pcVar8) {
      operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
    }
    InfoWriter::Write((InfoWriter *)local_278,"AM_CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE",
                      (string *)local_3f8);
    if ((pointer)local_3f8._0_8_ != pcVar1) {
      operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
    }
    InfoWriter::Write((InfoWriter *)local_278,"AM_BUILD_DIR",&(this->Dir).Build);
    InfoWriter::Write((InfoWriter *)local_278,"AM_INCLUDE_DIR",&(this->Dir).Include);
    InfoWriter::WriteConfig((InfoWriter *)local_278,"AM_INCLUDE_DIR",&(this->Dir).ConfigInclude);
    local_448._24_8_ = local_448 + 8;
    local_448._8_4_ = _S_red;
    local_448._16_8_ = 0;
    local_420 = 0;
    local_3f8._24_8_ = local_3f8 + 8;
    local_3f8._8_4_ = _S_red;
    local_3f8._16_8_ = 0;
    local_3d0 = 0;
    local_2a8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_2a8._M_impl.super__Rb_tree_header._M_header;
    local_2a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_2a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_2a8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_2d8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_2d8._M_impl.super__Rb_tree_header._M_header;
    local_2d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_2d8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_368._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_368._M_impl.super__Rb_tree_header._M_header;
    local_368._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_368._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_368._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_308._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_308._M_impl.super__Rb_tree_header._M_header;
    local_308._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_308._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_308._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_338._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_338._M_impl.super__Rb_tree_header._M_header;
    local_338._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_338._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_338._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_398._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_398._M_impl.super__Rb_tree_header._M_header;
    local_398._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_398._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_398._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var13 = (this->AutogenTarget).Headers._M_h._M_before_begin._M_nxt;
    local_428 = (_Base_ptr)local_448._24_8_;
    local_3d8 = (_Base_ptr)local_3f8._24_8_;
    local_3a4 = uVar10;
    local_3a0 = this_00;
    local_398._M_impl.super__Rb_tree_header._M_header._M_right =
         local_398._M_impl.super__Rb_tree_header._M_header._M_left;
    local_368._M_impl.super__Rb_tree_header._M_header._M_right =
         local_368._M_impl.super__Rb_tree_header._M_header._M_left;
    local_338._M_impl.super__Rb_tree_header._M_header._M_right =
         local_338._M_impl.super__Rb_tree_header._M_header._M_left;
    local_308._M_impl.super__Rb_tree_header._M_header._M_right =
         local_308._M_impl.super__Rb_tree_header._M_header._M_left;
    local_2d8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_2d8._M_impl.super__Rb_tree_header._M_header._M_left;
    local_2a8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_2a8._M_impl.super__Rb_tree_header._M_header._M_left;
    if (p_Var13 != (_Hash_node_base *)0x0) {
      do {
        pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 p_Var13[2]._M_nxt;
        if (((char)pbVar6[1]._M_string_length != '\x01') || (this->CMP0071Accept != false)) {
          if (*(undefined1 *)((long)&pbVar6[1]._M_string_length + 1) == '\x01') {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_368,pbVar6);
          }
          if (*(undefined1 *)((long)&pbVar6[1]._M_string_length + 2) == '\x01') {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_398,pbVar6);
          }
          cVar4 = *(undefined1 *)((long)&pbVar6[1]._M_string_length + 4);
          if (*(undefined1 *)((long)&pbVar6[1]._M_string_length + 3) == '\x01') {
            p_Var12 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       *)local_448;
            if (cVar4 == '\0') {
              p_Var12 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         *)&local_2a8;
            }
          }
          else {
            p_Var12 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       *)&local_308;
            if (cVar4 == '\0') goto LAB_003618b9;
          }
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>(p_Var12,pbVar6);
        }
LAB_003618b9:
        p_Var13 = p_Var13->_M_nxt;
      } while (p_Var13 != (_Hash_node_base *)0x0);
    }
    p_Var13 = (this->AutogenTarget).Sources._M_h._M_before_begin._M_nxt;
    if (p_Var13 != (_Hash_node_base *)0x0) {
      do {
        pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 p_Var13[2]._M_nxt;
        if (((char)pbVar6[1]._M_string_length != '\x01') || (this->CMP0071Accept != false)) {
          if (*(undefined1 *)((long)&pbVar6[1]._M_string_length + 1) == '\x01') {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_368,pbVar6);
          }
          if (*(undefined1 *)((long)&pbVar6[1]._M_string_length + 2) == '\x01') {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_398,pbVar6);
          }
          cVar4 = *(undefined1 *)((long)&pbVar6[1]._M_string_length + 4);
          if (*(undefined1 *)((long)&pbVar6[1]._M_string_length + 3) == '\x01') {
            p_Var12 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       *)local_3f8;
            if (cVar4 == '\0') {
              p_Var12 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         *)&local_2d8;
            }
          }
          else {
            p_Var12 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       *)&local_338;
            if (cVar4 == '\0') goto LAB_0036194e;
          }
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>(p_Var12,pbVar6);
        }
LAB_0036194e:
        p_Var13 = p_Var13->_M_nxt;
      } while (p_Var13 != (_Hash_node_base *)0x0);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"# Qt\n",5);
    InfoWriter::WriteUInt((InfoWriter *)local_278,"AM_QT_VERSION_MAJOR",(this->QtVersion).Major);
    InfoWriter::Write((InfoWriter *)local_278,"AM_QT_MOC_EXECUTABLE",
                      &(this->Moc).super_GenVarsT.Executable);
    InfoWriter::Write((InfoWriter *)local_278,"AM_QT_UIC_EXECUTABLE",
                      &(this->Uic).super_GenVarsT.Executable);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"# Files\n",8);
    InfoWriter::Write((InfoWriter *)local_278,"AM_SETTINGS_FILE",&(this->AutogenTarget).SettingsFile
                     );
    InfoWriter::WriteConfig
              ((InfoWriter *)local_278,"AM_SETTINGS_FILE",&(this->AutogenTarget).ConfigSettingsFile)
    ;
    InfoWriter::
    WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)local_278,"AM_HEADERS",
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_448);
    InfoWriter::
    WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)local_278,"AM_SOURCES",
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_3f8);
    if ((this->Moc).super_GenVarsT.Enabled == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,"# MOC settings\n",0xf);
      InfoWriter::
      WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_278,"AM_MOC_HEADERS",
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_2a8);
      InfoWriter::
      WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_278,"AM_MOC_SOURCES",
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_2d8);
      InfoWriter::
      WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_278,"AM_MOC_SKIP",
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_368);
      InfoWriter::
      WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_278,"AM_MOC_DEFINITIONS",&(this->Moc).Defines);
      InfoWriter::
      WriteConfigStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_278,"AM_MOC_DEFINITIONS",&(this->Moc).ConfigDefines);
      InfoWriter::
      WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_278,"AM_MOC_INCLUDES",&(this->Moc).Includes);
      InfoWriter::
      WriteConfigStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_278,"AM_MOC_INCLUDES",&(this->Moc).ConfigIncludes);
      pcVar7 = this->Target;
      paVar2 = &local_418.field_2;
      local_418._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"AUTOMOC_MOC_OPTIONS","")
      ;
      pcVar11 = cmGeneratorTarget::GetSafeProperty(pcVar7,&local_418);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,pcVar11,&local_449);
      InfoWriter::Write((InfoWriter *)local_278,"AM_MOC_OPTIONS",&local_3c8);
      paVar3 = &local_3c8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != paVar3) {
        operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != paVar2) {
        operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
      }
      local_3c8._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3c8,"CMAKE_AUTOMOC_RELAXED_MODE","");
      psVar9 = cmMakefile::GetSafeDefinition(local_3a0,&local_3c8);
      pcVar8 = (psVar9->_M_dataplus)._M_p;
      local_418._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_418,pcVar8,pcVar8 + psVar9->_M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != paVar3) {
        operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
      }
      InfoWriter::Write((InfoWriter *)local_278,"AM_MOC_RELAXED_MODE",&local_418);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != paVar2) {
        operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
      }
      pcVar7 = this->Target;
      local_418._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"AUTOMOC_MACRO_NAMES","")
      ;
      pcVar11 = cmGeneratorTarget::GetSafeProperty(pcVar7,&local_418);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,pcVar11,&local_449);
      InfoWriter::Write((InfoWriter *)local_278,"AM_MOC_MACRO_NAMES",&local_3c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != paVar3) {
        operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != paVar2) {
        operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
      }
      pcVar7 = this->Target;
      local_418._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_418,"AUTOMOC_DEPEND_FILTERS","");
      pcVar11 = cmGeneratorTarget::GetSafeProperty(pcVar7,&local_418);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,pcVar11,&local_449);
      InfoWriter::Write((InfoWriter *)local_278,"AM_MOC_DEPEND_FILTERS",&local_3c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != paVar3) {
        operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != paVar2) {
        operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
      }
      InfoWriter::Write((InfoWriter *)local_278,"AM_MOC_PREDEFS_CMD",&(this->Moc).PredefsCmd);
    }
    if ((this->Uic).super_GenVarsT.Enabled == true) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&local_398,
                 (this->Uic).SkipUi._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                 (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )&(this->Uic).SkipUi._M_t._M_impl.super__Rb_tree_header);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,"# UIC settings\n",0xf);
      InfoWriter::
      WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_278,"AM_UIC_HEADERS",
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_308);
      InfoWriter::
      WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_278,"AM_UIC_SOURCES",
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_338);
      InfoWriter::
      WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_278,"AM_UIC_SKIP",
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_398);
      InfoWriter::
      WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_278,"AM_UIC_TARGET_OPTIONS",&(this->Uic).Options);
      InfoWriter::
      WriteConfigStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_278,"AM_UIC_TARGET_OPTIONS",&(this->Uic).ConfigOptions);
      InfoWriter::
      WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_278,"AM_UIC_OPTIONS_FILES",&(this->Uic).FileFiles);
      InfoWriter::WriteNestedLists
                ((InfoWriter *)local_278,"AM_UIC_OPTIONS_OPTIONS",&(this->Uic).FileOptions);
      InfoWriter::
      WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_278,"AM_UIC_SEARCH_PATHS",&(this->Uic).SearchPaths);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_398);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_338);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_308);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_368);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_2d8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_2a8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3f8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_448);
    uVar10 = local_3a4;
  }
  else {
    local_448._0_8_ = local_448 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_448,"AutoGen: Could not write file ","");
    std::__cxx11::string::_M_append
              (local_448,(ulong)(this->AutogenTarget).InfoFile._M_dataplus._M_p);
    cmSystemTools::Error((string *)local_448);
    if ((undefined1 *)local_448._0_8_ != local_448 + 0x10) {
      operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
    }
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  return (uVar10 & 5) == 0;
}

Assistant:

bool cmQtAutoGenInitializer::SetupWriteAutogenInfo()
{
  InfoWriter ofs(this->AutogenTarget.InfoFile);
  if (ofs) {
    // Utility lambdas
    cmMakefile* makefile = this->Target->Target->GetMakefile();
    auto MfDef = [makefile](const char* key) {
      return makefile->GetSafeDefinition(key);
    };

    // Write common settings
    ofs.Write("# Meta\n");
    ofs.Write("AM_MULTI_CONFIG", this->MultiConfig ? "TRUE" : "FALSE");
    ofs.Write("AM_PARALLEL", this->AutogenTarget.Parallel);
    ofs.Write("AM_VERBOSITY", this->Verbosity);

    ofs.Write("# Directories\n");
    ofs.Write("AM_CMAKE_SOURCE_DIR", MfDef("CMAKE_SOURCE_DIR"));
    ofs.Write("AM_CMAKE_BINARY_DIR", MfDef("CMAKE_BINARY_DIR"));
    ofs.Write("AM_CMAKE_CURRENT_SOURCE_DIR",
              MfDef("CMAKE_CURRENT_SOURCE_DIR"));
    ofs.Write("AM_CMAKE_CURRENT_BINARY_DIR",
              MfDef("CMAKE_CURRENT_BINARY_DIR"));
    ofs.Write("AM_CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE",
              MfDef("CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE"));
    ofs.Write("AM_BUILD_DIR", this->Dir.Build);
    ofs.Write("AM_INCLUDE_DIR", this->Dir.Include);
    ofs.WriteConfig("AM_INCLUDE_DIR", this->Dir.ConfigInclude);

    // Use sorted sets
    std::set<std::string> headers;
    std::set<std::string> sources;
    std::set<std::string> moc_headers;
    std::set<std::string> moc_sources;
    std::set<std::string> moc_skip;
    std::set<std::string> uic_headers;
    std::set<std::string> uic_sources;
    std::set<std::string> uic_skip;
    // Filter headers
    for (auto const& pair : this->AutogenTarget.Headers) {
      MUFile const& muf = *pair.second;
      if (muf.Generated && !this->CMP0071Accept) {
        continue;
      }
      if (muf.SkipMoc) {
        moc_skip.insert(muf.RealPath);
      }
      if (muf.SkipUic) {
        uic_skip.insert(muf.RealPath);
      }
      if (muf.MocIt && muf.UicIt) {
        headers.insert(muf.RealPath);
      } else if (muf.MocIt) {
        moc_headers.insert(muf.RealPath);
      } else if (muf.UicIt) {
        uic_headers.insert(muf.RealPath);
      }
    }
    // Filter sources
    for (auto const& pair : this->AutogenTarget.Sources) {
      MUFile const& muf = *pair.second;
      if (muf.Generated && !this->CMP0071Accept) {
        continue;
      }
      if (muf.SkipMoc) {
        moc_skip.insert(muf.RealPath);
      }
      if (muf.SkipUic) {
        uic_skip.insert(muf.RealPath);
      }
      if (muf.MocIt && muf.UicIt) {
        sources.insert(muf.RealPath);
      } else if (muf.MocIt) {
        moc_sources.insert(muf.RealPath);
      } else if (muf.UicIt) {
        uic_sources.insert(muf.RealPath);
      }
    }

    ofs.Write("# Qt\n");
    ofs.WriteUInt("AM_QT_VERSION_MAJOR", this->QtVersion.Major);
    ofs.Write("AM_QT_MOC_EXECUTABLE", this->Moc.Executable);
    ofs.Write("AM_QT_UIC_EXECUTABLE", this->Uic.Executable);

    ofs.Write("# Files\n");
    ofs.Write("AM_SETTINGS_FILE", this->AutogenTarget.SettingsFile);
    ofs.WriteConfig("AM_SETTINGS_FILE",
                    this->AutogenTarget.ConfigSettingsFile);
    ofs.WriteStrings("AM_HEADERS", headers);
    ofs.WriteStrings("AM_SOURCES", sources);

    // Write moc settings
    if (this->Moc.Enabled) {
      ofs.Write("# MOC settings\n");
      ofs.WriteStrings("AM_MOC_HEADERS", moc_headers);
      ofs.WriteStrings("AM_MOC_SOURCES", moc_sources);
      ofs.WriteStrings("AM_MOC_SKIP", moc_skip);
      ofs.WriteStrings("AM_MOC_DEFINITIONS", this->Moc.Defines);
      ofs.WriteConfigStrings("AM_MOC_DEFINITIONS", this->Moc.ConfigDefines);
      ofs.WriteStrings("AM_MOC_INCLUDES", this->Moc.Includes);
      ofs.WriteConfigStrings("AM_MOC_INCLUDES", this->Moc.ConfigIncludes);
      ofs.Write("AM_MOC_OPTIONS",
                this->Target->GetSafeProperty("AUTOMOC_MOC_OPTIONS"));
      ofs.Write("AM_MOC_RELAXED_MODE", MfDef("CMAKE_AUTOMOC_RELAXED_MODE"));
      ofs.Write("AM_MOC_MACRO_NAMES",
                this->Target->GetSafeProperty("AUTOMOC_MACRO_NAMES"));
      ofs.Write("AM_MOC_DEPEND_FILTERS",
                this->Target->GetSafeProperty("AUTOMOC_DEPEND_FILTERS"));
      ofs.Write("AM_MOC_PREDEFS_CMD", this->Moc.PredefsCmd);
    }

    // Write uic settings
    if (this->Uic.Enabled) {
      // Add skipped .ui files
      uic_skip.insert(this->Uic.SkipUi.begin(), this->Uic.SkipUi.end());

      ofs.Write("# UIC settings\n");
      ofs.WriteStrings("AM_UIC_HEADERS", uic_headers);
      ofs.WriteStrings("AM_UIC_SOURCES", uic_sources);
      ofs.WriteStrings("AM_UIC_SKIP", uic_skip);
      ofs.WriteStrings("AM_UIC_TARGET_OPTIONS", this->Uic.Options);
      ofs.WriteConfigStrings("AM_UIC_TARGET_OPTIONS", this->Uic.ConfigOptions);
      ofs.WriteStrings("AM_UIC_OPTIONS_FILES", this->Uic.FileFiles);
      ofs.WriteNestedLists("AM_UIC_OPTIONS_OPTIONS", this->Uic.FileOptions);
      ofs.WriteStrings("AM_UIC_SEARCH_PATHS", this->Uic.SearchPaths);
    }
  } else {
    std::string err = "AutoGen: Could not write file ";
    err += this->AutogenTarget.InfoFile;
    cmSystemTools::Error(err);
    return false;
  }

  return true;
}